

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_ge_parse_ext(secp256k1_ge *ge,uchar *in33)

{
  int iVar1;
  void *in_RSI;
  uchar zeros [33];
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  secp256k1_ge *in_stack_00000058;
  undefined1 auStack_48 [48];
  void *local_18;
  int local_4;
  
  local_18 = in_RSI;
  memset(auStack_48,0,0x21);
  iVar1 = secp256k1_memcmp_var(local_18,auStack_48,0x21);
  if (iVar1 == 0) {
    secp256k1_ge_set_infinity((secp256k1_ge *)0x10ac4e);
    local_4 = 1;
  }
  else {
    iVar1 = secp256k1_eckey_pubkey_parse(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)0x10ac85);
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_musig_ge_parse_ext(secp256k1_ge* ge, const unsigned char *in33) {
    unsigned char zeros[33] = { 0 };

    if (secp256k1_memcmp_var(in33, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
        return 1;
    }
    if (!secp256k1_eckey_pubkey_parse(ge, in33, 33)) {
        return 0;
    }
    return secp256k1_ge_is_in_correct_subgroup(ge);
}